

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::evalSubscriptMat2(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  Vector<float,_2> res;
  Vector<float,_2> res_1;
  float local_20 [6];
  int local_8 [2];
  
  local_20[3] = (c->coords).m_data[1];
  local_20[2] = (c->coords).m_data[0];
  local_20[0] = local_20[3];
  local_20[1] = (c->coords).m_data[2];
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    res.m_data[lVar1] = local_20[lVar1] * 0.5;
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    res_1.m_data[lVar1] = local_20[lVar1 + 2] + res.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  local_8[0] = 0;
  local_8[1] = 1;
  lVar1 = 0;
  do {
    (c->color).m_data[local_8[lVar1]] = res_1.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }